

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O1

Vertices_iterator * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
vertices_iterator_end
          (Vertices_iterator *__return_storage_ptr__,
          Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_11;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->counter,
             (ulong)((long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 & 0xffffffff,&local_11);
  __return_storage_ptr__->b = this;
  puVar1 = (this->super_Bitmap_cubical_complex_base<double>).sizes.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2 & 0xffffffff;
  if (uVar4 != 0) {
    p_Var2 = (this->directions_in_which_periodic_b_cond_are_to_be_imposed).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
             super__Bit_iterator_base._M_p;
    puVar3 = (__return_storage_ptr__->counter).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      puVar3[uVar5] =
           (ulong)(puVar1[uVar5] - (uint)((p_Var2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0));
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  puVar3 = (__return_storage_ptr__->counter).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar3 = *puVar3 + 1;
  return __return_storage_ptr__;
}

Assistant:

Vertices_iterator vertices_iterator_end() {
    Vertices_iterator a(this);
    for (std::size_t i = 0; i != this->dimension(); ++i) {
      a.counter[i] = this->sizes[i] - this->directions_in_which_periodic_b_cond_are_to_be_imposed[i];
    }
    a.counter[0]++;
    return a;
  }